

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_sock.c
# Opt level: O0

_Bool uo_sock_init(void)

{
  _Bool local_9;
  
  if (is_init) {
    local_9 = true;
  }
  else {
    is_init = true;
    atexit(uo_sock_quit);
    local_9 = (_Bool)(is_init & 1);
  }
  return local_9;
}

Assistant:

bool uo_sock_init()
{
    if (is_init)
        return true;

    is_init = true;

    #ifdef UO_SOCK_WIN32

        is_init &= WSAStartup(MAKEWORD(1, 1), &WsaDat) == 0;

    #endif

    atexit(uo_sock_quit);
    return is_init;
}